

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O0

void density::
     heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>_>
     ::cancel_put_impl(ControlBlock *i_control_block)

{
  FunctionRuntimeType<(density::function_type_erasure)0,_double_()> *this;
  void *i_dest;
  FunctionRuntimeType<(density::function_type_erasure)0,_double_()> *type_ptr;
  ControlBlock *i_control_block_local;
  
  this = type_after_control(i_control_block);
  i_dest = get_element(i_control_block);
  detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>::destroy(this,i_dest);
  if ((i_control_block->m_next & 3) != 0) {
    density_tests::detail::assert_failed<>
              ("(i_control_block->m_next & (detail::Queue_Busy | detail::Queue_Dead)) == 0",
               anon_var_dwarf_12e55,0xb34);
  }
  i_control_block->m_next = i_control_block->m_next + 2;
  return;
}

Assistant:

DENSITY_NO_INLINE static void cancel_put_impl(ControlBlock * i_control_block)
        {
            const auto type_ptr = type_after_control(i_control_block);
            type_ptr->destroy(get_element(i_control_block));

            type_ptr->RUNTIME_TYPE::~RUNTIME_TYPE();

            DENSITY_ASSERT_INTERNAL(
              (i_control_block->m_next & (detail::Queue_Busy | detail::Queue_Dead)) == 0);
            i_control_block->m_next += detail::Queue_Dead;
        }